

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSExporter::WritePercentChunk(Discreet3DSExporter *this,float f)

{
  undefined1 local_28 [8];
  ChunkWriter chunk;
  float f_local;
  Discreet3DSExporter *this_local;
  
  chunk.chunk_start_pos._4_4_ = f;
  anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)local_28,&this->writer,0x31);
  StreamWriter<false,_false>::PutF4(&this->writer,chunk.chunk_start_pos._4_4_);
  anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)local_28);
  return;
}

Assistant:

void Discreet3DSExporter::WritePercentChunk(float f) {
    ChunkWriter chunk(writer, Discreet3DS::CHUNK_PERCENTF);
    writer.PutF4(f);
}